

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_iterator.hpp
# Opt level: O3

void __thiscall
burst::
union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/range/adaptor/united.cpp:45:33)>
::maintain_invariant
          (union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_adaptor_united_cpp:45:33)>
           *this)

{
  iterator_range<std::_Fwd_list_const_iterator<int>_> *piVar1;
  _Fwd_list_node_base *p_Var2;
  iterator_range<std::_Fwd_list_const_iterator<int>_> *piVar3;
  long lVar4;
  undefined8 unaff_RBX;
  __normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>
  __first;
  ulong uVar5;
  __normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>
  __last;
  __normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>
  __i;
  __normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>
  __last_00;
  _Iter_comp_iter<burst::compose_fn<burst::apply_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_adaptor_united_cpp:45:33)>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  in_stack_00000008;
  
  __first._M_current = (this->m_begin)._M_current;
  piVar1 = (this->m_end)._M_current;
  uVar5 = (long)piVar1 - (long)__first._M_current;
  piVar3 = __first._M_current;
  if (0 < (long)uVar5 >> 6) {
    piVar3 = (iterator_range<std::_Fwd_list_const_iterator<int>_> *)
             ((long)&((__first._M_current)->
                     super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                     ).m_Begin._M_node + (uVar5 & 0xffffffffffffffc0));
    lVar4 = ((long)uVar5 >> 6) + 1;
    __last._M_current = __first._M_current + 2;
    do {
      if (__last._M_current[-2].
          super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_node ==
          __last._M_current[-2].
          super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_node) {
        __last._M_current = __last._M_current + -2;
        goto LAB_002b15a1;
      }
      if (__last._M_current[-1].
          super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_node ==
          __last._M_current[-1].
          super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_node) {
        __last._M_current = __last._M_current + -1;
        goto LAB_002b15a1;
      }
      if (((__last._M_current)->
          super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ).m_Begin._M_node ==
          ((__last._M_current)->
          super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ).m_End._M_node) goto LAB_002b15a1;
      if (__last._M_current[1].
          super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_node ==
          __last._M_current[1].
          super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_node) {
        __last._M_current = __last._M_current + 1;
        goto LAB_002b15a1;
      }
      lVar4 = lVar4 + -1;
      __last._M_current = __last._M_current + 4;
    } while (1 < lVar4);
    uVar5 = (long)piVar1 - (long)piVar3;
  }
  lVar4 = (long)uVar5 >> 4;
  if (lVar4 == 1) {
LAB_002b157c:
    __last._M_current = piVar3;
    if ((piVar3->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_Begin._M_node !=
        (piVar3->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_End._M_node) {
      __last._M_current = piVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_002b156f:
    __last._M_current = piVar3;
    if ((piVar3->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_Begin._M_node !=
        (piVar3->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_End._M_node) {
      piVar3 = piVar3 + 1;
      goto LAB_002b157c;
    }
  }
  else {
    __last._M_current = piVar1;
    if (lVar4 != 3) goto LAB_002b15d7;
    __last._M_current = piVar3;
    if ((piVar3->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_Begin._M_node !=
        (piVar3->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_End._M_node) {
      piVar3 = piVar3 + 1;
      goto LAB_002b156f;
    }
  }
LAB_002b15a1:
  piVar3 = __last._M_current + 1;
  if (piVar3 != piVar1 && __last._M_current != piVar1) {
    do {
      if ((piVar3->
          super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ).m_Begin._M_node !=
          (piVar3->
          super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ).m_End._M_node) {
        p_Var2 = (piVar3->
                 super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                 ).m_End._M_node;
        ((__last._M_current)->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_Begin._M_node =
             (piVar3->
             super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
             ).m_Begin._M_node;
        ((__last._M_current)->
        super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        ).m_End._M_node = p_Var2;
        __last._M_current = __last._M_current + 1;
      }
      piVar3 = piVar3 + 1;
    } while (piVar3 != piVar1);
    __first._M_current = (this->m_begin)._M_current;
  }
LAB_002b15d7:
  (this->m_end)._M_current = __last._M_current;
  if (__first._M_current != __last._M_current) {
    uVar5 = (long)__last._M_current - (long)__first._M_current >> 4;
    lVar4 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>*,std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_7()::__0>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
              (__first,__last,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<burst::compose_fn<burst::apply_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_adaptor_united_cpp:45:33)>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
                )SUB83(unaff_RBX,0));
    if ((long)__last._M_current - (long)__first._M_current < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>*,std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_7()::__0>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
                (__first,__last,in_stack_00000008);
      return;
    }
    __last_00._M_current = __first._M_current + 0x10;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>*,std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_7()::__0>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
              (__first,__last_00,
               (_Iter_comp_iter<burst::compose_fn<burst::apply_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_adaptor_united_cpp:45:33)>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
                )SUB83(unaff_RBX,0));
    for (; __last_00._M_current != __last._M_current;
        __last_00._M_current = __last_00._M_current + 1) {
      std::
      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>*,std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>>>,__gnu_cxx::__ops::_Val_comp_iter<burst::compose_fn<burst::apply_fn<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_7()::__0>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
                (__last_00,
                 (_Val_comp_iter<burst::compose_fn<burst::apply_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_adaptor_united_cpp:45:33)>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
                  )SUB83(unaff_RBX,0));
    }
  }
  return;
}

Assistant:

void remove_empty_ranges ()
        {
            m_end = std::remove_if(m_begin, m_end, [] (const auto & r) {return r.empty();});
        }